

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptRegularExpression.cpp
# Opt level: O1

Var Js::JavascriptRegExp::EntrySymbolReplace(RecyclableObject *function,CallInfo callInfo,...)

{
  ScriptContext *pSVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  ScriptContext *entryFunctionContext;
  JavascriptString *input;
  RecyclableObject *aValue;
  JavascriptString *pJVar5;
  Var pvVar6;
  RecyclableObject *in_R8;
  int in_stack_00000010;
  undefined1 local_40 [8];
  ArgumentReader args;
  CallInfo callInfo_local;
  
  pSVar1 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  args.super_Arguments.Values = (Type)callInfo;
  ThreadContext::ProbeStack(pSVar1->threadContext,0xc00,pSVar1,(PVOID)0x0);
  if (in_stack_00000010 != (int)args.super_Arguments.Values) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptRegularExpression.cpp"
                                ,0x2fe,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar3) goto LAB_00d15f70;
    *puVar4 = 0;
  }
  args.super_Arguments.Info = (Type)&stack0x00000018;
  local_40 = (undefined1  [8])args.super_Arguments.Values;
  ArgumentReader::AdjustArguments
            ((ArgumentReader *)local_40,(CallInfo *)&args.super_Arguments.Values);
  if (((ulong)args.super_Arguments.Values & 0x1000000) != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptRegularExpression.cpp"
                                ,0x2ff,"(!(callInfo.Flags & CallFlags_New))",
                                "!(callInfo.Flags & CallFlags_New)");
    if (!bVar3) {
LAB_00d15f70:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar4 = 0;
  }
  pSVar1 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  entryFunctionContext =
       (ScriptContext *)
       GetThisObject((Arguments *)local_40,L"RegExp.prototype[Symbol.replace]",pSVar1);
  input = GetFirstStringArg((Arguments *)local_40,pSVar1);
  if ((local_40._0_4_ & 0xffffff) < 3) {
    aValue = (((pSVar1->super_ScriptContextBase).javascriptLibrary)->super_JavascriptLibraryBase).
             undefinedValue.ptr;
  }
  else {
    aValue = (RecyclableObject *)Arguments::operator[]((Arguments *)local_40,2);
  }
  bVar3 = JavascriptConversion::IsCallable(aValue);
  if (bVar3) {
    pJVar5 = (JavascriptString *)VarTo<Js::RecyclableObject>(aValue);
    pvVar6 = RegexHelper::RegexReplaceFunction
                       ((RegexHelper *)pSVar1,entryFunctionContext,&input->super_RecyclableObject,
                        pJVar5,in_R8);
  }
  else {
    pJVar5 = JavascriptConversion::ToString(aValue,pSVar1);
    bVar3 = RegexHelper::IsResultNotUsed((uint)args.super_Arguments.Values._3_1_);
    pvVar6 = RegexHelper::RegexReplace
                       (pSVar1,(RecyclableObject *)entryFunctionContext,input,pJVar5,bVar3);
  }
  return pvVar6;
}

Assistant:

Var JavascriptRegExp::EntrySymbolReplace(RecyclableObject* function, CallInfo callInfo, ...)
    {
        PROBE_STACK(function->GetScriptContext(), Js::Constants::MinStackDefault);
        ARGUMENTS(args, callInfo);
        Assert(!(callInfo.Flags & CallFlags_New));

        ScriptContext* scriptContext = function->GetScriptContext();

        CHAKRATEL_LANGSTATS_INC_LANGFEATURECOUNT(ES6, RegexSymbolReplace, scriptContext);

        PCWSTR varName = _u("RegExp.prototype[Symbol.replace]");

        RecyclableObject* thisObj = GetThisObject(args, varName, scriptContext);
        JavascriptString* string = GetFirstStringArg(args, scriptContext);

        Var replaceValue = (args.Info.Count > 2) ? args[2] : scriptContext->GetLibrary()->GetUndefined();

        if (JavascriptConversion::IsCallable(replaceValue))
        {
            RecyclableObject* replaceFunction = VarTo<RecyclableObject>(replaceValue);
            return RegexHelper::RegexReplaceFunction(scriptContext, thisObj, string, replaceFunction);
        }
        else
        {
            JavascriptString* replaceString = JavascriptConversion::ToString(replaceValue, scriptContext);
            return RegexHelper::RegexReplace(
                scriptContext,
                thisObj,
                string,
                replaceString,
                RegexHelper::IsResultNotUsed(callInfo.Flags));
        }
    }